

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyAssignedOnReset.cpp
# Opt level: O0

void __thiscall
only_assigned_on_reset::MainVisitor::handle(AlwaysFFVisitor *this,VariableSymbol *symbol)

{
  string_view resetName;
  string_view name;
  string_view arg;
  bool bVar1;
  byte bVar2;
  SourceLocation location;
  _Storage<slang::SourceLocation,_true> this_00;
  SourceLocation SVar3;
  undefined1 uVar4;
  long in_RSI;
  long in_RDI;
  optional<slang::SourceLocation> oVar5;
  AlwaysFFVisitor visitor;
  CheckConfigs *configs;
  ValueDriver *firstDriver;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffdb8;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_fffffffffffffdc0;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *this_01;
  Symbol *this_02;
  undefined1 *puVar6;
  undefined7 in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffe09;
  SourceManager *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  ValueSymbol *in_stack_fffffffffffffea8;
  TidyVisitor *in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  undefined1 local_a8 [128];
  undefined8 local_28;
  string_view local_20;
  long local_10;
  
  local_10 = in_RSI;
  slang::not_null<const_slang::SourceManager_*>::operator->
            ((not_null<const_slang::SourceManager_*> *)0x21c039);
  local_28 = *(undefined8 *)(local_10 + 0x18);
  local_20 = slang::SourceManager::getFileName(in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  bVar1 = TidyVisitor::skip(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  if (!bVar1) {
    puVar6 = local_a8;
    slang::ast::ValueSymbol::drivers(in_stack_fffffffffffffea8);
    bVar2 = std::ranges::
            subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
            ::empty((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                     *)0x21c0b6);
    std::ranges::
    subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
    ::~subrange(in_stack_fffffffffffffdc0);
    if ((bVar2 & 1) == 0) {
      this_02 = (Symbol *)&stack0xfffffffffffffe80;
      slang::ast::ValueSymbol::drivers(in_stack_fffffffffffffea8);
      std::ranges::
      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
      ::begin(in_stack_fffffffffffffdb8);
      uVar4 = (undefined1)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
      location = (SourceLocation)
                 slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::
                 const_iterator::operator*((const_iterator *)this_02);
      this_01 = *(subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                  **)location;
      slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
      ~const_iterator((const_iterator *)0x21c15a);
      std::ranges::
      subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
      ::~subrange(this_01);
      if ((this_01 !=
           (subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
            *)0x0) &&
         (*(char *)((long)&(this_01->_M_begin).path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap + 2) ==
          '\x05')) {
        TidyConfig::getCheckConfigs(*(TidyConfig **)(in_RDI + 0x10));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
        name._M_str._0_7_ = in_stack_fffffffffffffde0;
        name._M_len = (size_t)puVar6;
        name._M_str._7_1_ = bVar2;
        resetName._M_str._0_4_ = (int)this_02;
        resetName._M_len = (size_t)location;
        resetName._M_str._4_4_ = (int)((ulong)this_02 >> 0x20);
        AlwaysFFVisitor::AlwaysFFVisitor((AlwaysFFVisitor *)this_01,name,resetName,(bool)uVar4);
        slang::not_null<const_slang::ast::Symbol_*>::operator->
                  ((not_null<const_slang::ast::Symbol_*> *)0x21c22c);
        slang::ast::Symbol::visit<only_assigned_on_reset::AlwaysFFVisitor&>
                  (this_02,(AlwaysFFVisitor *)location);
        bVar1 = AlwaysFFVisitor::hasError((AlwaysFFVisitor *)&stack0xfffffffffffffe40);
        if (bVar1) {
          oVar5 = AlwaysFFVisitor::getErrorLocation((AlwaysFFVisitor *)&stack0xfffffffffffffe40);
          this_00 = oVar5.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::SourceLocation>._M_payload;
          uVar4 = oVar5.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceLocation>._M_engaged;
          SVar3 = std::optional<slang::SourceLocation>::value_or<slang::SourceLocation_const&>
                            ((optional<slang::SourceLocation> *)location,(SourceLocation *)this_01);
          slang::Diagnostics::add((Diagnostics *)this_01,SUB84((ulong)this_02 >> 0x20,0),location);
          arg._M_len._1_7_ = in_stack_fffffffffffffe09;
          arg._M_len._0_1_ = uVar4;
          arg._M_str = (char *)SVar3;
          slang::Diagnostic::operator<<((Diagnostic *)this_00,arg);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const VariableSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.drivers().empty())
            return;

        auto firstDriver = *symbol.drivers().begin();
        if (firstDriver && firstDriver->source == DriverSource::AlwaysFF) {
            auto& configs = config.getCheckConfigs();
            AlwaysFFVisitor visitor(symbol.name, configs.resetName, configs.resetIsActiveHigh);
            firstDriver->containingSymbol->visit(visitor);
            if (visitor.hasError()) {
                diags.add(diag::RegisterNotAssignedOnReset,
                          visitor.getErrorLocation().value_or(symbol.location))
                    << symbol.name;
            }
        }
    }